

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void init_frame_info(FRAME_INFO *frame_info,AV1_COMMON *cm)

{
  SequenceHeader *pSVar1;
  SequenceHeader *seq_params;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm_local;
  FRAME_INFO *frame_info_local;
  
  pSVar1 = cm->seq_params;
  frame_info->frame_width = cm->width;
  frame_info->frame_height = cm->height;
  frame_info->mi_cols = (cm->mi_params).mi_cols;
  frame_info->mi_rows = (cm->mi_params).mi_rows;
  frame_info->mb_cols = (cm->mi_params).mb_cols;
  frame_info->mb_rows = (cm->mi_params).mb_rows;
  frame_info->num_mbs = (cm->mi_params).MBs;
  frame_info->bit_depth = pSVar1->bit_depth;
  frame_info->subsampling_x = pSVar1->subsampling_x;
  frame_info->subsampling_y = pSVar1->subsampling_y;
  return;
}

Assistant:

static inline void init_frame_info(FRAME_INFO *frame_info,
                                   const AV1_COMMON *const cm) {
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const SequenceHeader *const seq_params = cm->seq_params;
  frame_info->frame_width = cm->width;
  frame_info->frame_height = cm->height;
  frame_info->mi_cols = mi_params->mi_cols;
  frame_info->mi_rows = mi_params->mi_rows;
  frame_info->mb_cols = mi_params->mb_cols;
  frame_info->mb_rows = mi_params->mb_rows;
  frame_info->num_mbs = mi_params->MBs;
  frame_info->bit_depth = seq_params->bit_depth;
  frame_info->subsampling_x = seq_params->subsampling_x;
  frame_info->subsampling_y = seq_params->subsampling_y;
}